

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O1

word Abc_Tt6Stretch(word t,int nVars)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  word wVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  
  if (nVars < 0) {
    __assert_fail("nVars >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                  ,0x30d,"word Abc_Tt6Stretch(word, int)");
  }
  iVar1 = 1;
  if (1U < (uint)nVars) {
    iVar1 = nVars;
  }
  iVar8 = 2;
  if (1U < (uint)nVars) {
    iVar8 = iVar1;
  }
  iVar1 = 3;
  if (iVar8 != 2) {
    iVar1 = iVar8;
  }
  iVar2 = 4;
  if (iVar1 != 3) {
    iVar2 = iVar1;
  }
  iVar4 = 5;
  if (iVar2 != 4) {
    iVar4 = iVar2;
  }
  if (iVar4 - 5U < 2) {
    uVar7 = ((uint)t & 1) * 3;
    if (nVars != 0) {
      uVar7 = (uint)t;
    }
    wVar5 = (ulong)(uVar7 & 3) * 5;
    if (1 < (uint)nVars) {
      wVar5 = t;
    }
    uVar7 = (uint)wVar5 & 0xf;
    uVar6 = (ulong)(uVar7 << 4 | uVar7);
    if (iVar8 != 2) {
      uVar6 = wVar5;
    }
    uVar3 = (ulong)(uint)((int)(uVar6 & 0xff) << 8) | uVar6 & 0xff;
    if (iVar1 != 3) {
      uVar3 = uVar6;
    }
    uVar6 = (ulong)(uint)((int)uVar3 << 0x10) | uVar3 & 0xffff;
    if (iVar2 != 4) {
      uVar6 = uVar3;
    }
    uVar3 = uVar6 << 0x20 | uVar6 & 0xffffffff;
    if (iVar4 != 5) {
      uVar3 = uVar6;
    }
    return uVar3;
  }
  __assert_fail("nVars == 6",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                ,0x31a,"word Abc_Tt6Stretch(word, int)");
}

Assistant:

static inline word Abc_Tt6Stretch( word t, int nVars )
{
    assert( nVars >= 0 );
    if ( nVars == 0 )
        nVars++, t = (t & 0x1) | ((t & 0x1) << 1);
    if ( nVars == 1 )
        nVars++, t = (t & 0x3) | ((t & 0x3) << 2);
    if ( nVars == 2 )
        nVars++, t = (t & 0xF) | ((t & 0xF) << 4);
    if ( nVars == 3 )
        nVars++, t = (t & 0xFF) | ((t & 0xFF) << 8);
    if ( nVars == 4 )
        nVars++, t = (t & 0xFFFF) | ((t & 0xFFFF) << 16);
    if ( nVars == 5 )
        nVars++, t = (t & 0xFFFFFFFF) | ((t & 0xFFFFFFFF) << 32);
    assert( nVars == 6 );
    return t;
}